

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O3

vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
* ColorTracker::getContours
            (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *__return_storage_ptr__,Mat *mask)

{
  runtime_error *this;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_178;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_170;
  long local_168;
  long lStack_160;
  long *local_158;
  Mat *local_150;
  long local_148;
  long lStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined8 local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((*(ushort *)mask & 0xff8) == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148 = 0;
    local_158 = (long *)CONCAT44(local_158._4_4_,0x1010000);
    local_168 = 0;
    local_178 = (long *)CONCAT44(local_178._4_4_,0x8204000c);
    local_b8 = 0;
    local_170 = __return_storage_ptr__;
    local_150 = mask;
    cv::findContours(&local_158,&local_178,0,3);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
             ,"");
  std::operator+(&local_90,"in ",&local_d8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_138._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_138._M_dataplus._M_p == psVar2) {
    local_138.field_2._M_allocated_capacity = *psVar2;
    local_138.field_2._8_8_ = plVar1[3];
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar2;
  }
  local_138._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_b0,0xf2);
  std::operator+(&local_70,&local_138,&local_b0);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_118._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_118._M_dataplus._M_p == psVar2) {
    local_118.field_2._M_allocated_capacity = *psVar2;
    local_118.field_2._8_4_ = (undefined4)plVar1[3];
    local_118.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar2;
  }
  local_118._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"getContours","");
  std::operator+(&local_50,&local_118,&local_f8);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_178 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_178 == plVar3) {
    local_168 = *plVar3;
    lStack_160 = plVar1[3];
    local_178 = &local_168;
  }
  else {
    local_168 = *plVar3;
  }
  local_170 = (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_158 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_158 == plVar3) {
    local_148 = *plVar3;
    lStack_140 = plVar1[3];
    local_158 = &local_148;
  }
  else {
    local_148 = *plVar3;
  }
  local_150 = (Mat *)plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_158);
  *(undefined ***)this = &PTR__runtime_error_0011d9d8;
  __cxa_throw(this,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<vector<Point>> ColorTracker::getContours(const Mat& mask) noexcept(false){
    if(mask.channels()!=1){
        //cout << "invalid input" << endl;
        throw ProcessingException(WHERE + "invalid input: passed image must have 1 channel");
    }
    vector<vector<Point>> contours;

    cv::findContours(mask,contours,cv::RETR_EXTERNAL,cv::CHAIN_APPROX_TC89_L1);

    return contours;
}